

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O2

Person * __thiscall Person::operator=(Person *this,Person *person)

{
  std::__cxx11::string::_M_assign((string *)&this->id);
  std::__cxx11::string::_M_assign((string *)&this->name);
  Address::operator=(&this->address,&person->address);
  return this;
}

Assistant:

Person &Person::operator=(const Person &person) {
    id = person.id;
    name = person.name;
    address = person.address;
    return *this;
}